

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::RecordAllBigIntConstants(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  int iVar1;
  uint32 cch;
  Type pSVar2;
  ParseNode *this_00;
  IdentPtr pIVar3;
  RegSlot RVar4;
  FuncInfo *this_01;
  FunctionBody *this_02;
  ParseNodeBigInt *pPVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  this_01 = TopFuncInfo(this);
  this_02 = FuncInfo::GetParsedFunctionBody(this_01);
  uVar6 = (funcInfo->bigintToRegister).bucketCount;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      iVar8 = (funcInfo->bigintToRegister).buckets[uVar7];
      if (iVar8 != -1) {
        do {
          pSVar2 = (funcInfo->bigintToRegister).entries;
          RVar4 = pSVar2[iVar8].
                  super_DefaultHashedEntry<ParseNode_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<ParseNode_*,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>.value;
          iVar1 = pSVar2[iVar8].
                  super_DefaultHashedEntry<ParseNode_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<ParseNode_*,_unsigned_int>.
                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>_>
                  .super_KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>.next;
          this_00 = pSVar2[iVar8].
                    super_DefaultHashedEntry<ParseNode_*,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<ParseNode_*,_unsigned_int>.
                    super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>_>
                    .super_KeyValueEntryDataLayout2<ParseNode_*,_unsigned_int>.key;
          pPVar5 = ParseNode::AsParseNodeBigInt(this_00);
          pIVar3 = pPVar5->pid;
          RVar4 = Js::FunctionBody::MapRegSlot(this_02,RVar4);
          cch = pIVar3->m_cch;
          pPVar5 = ParseNode::AsParseNodeBigInt(this_00);
          Js::FunctionBody::RecordBigIntConstant
                    (this_02,RVar4,(LPCOLESTR)&pIVar3->field_0x22,cch,(bool)(pPVar5->field_0x18 & 1)
                    );
          iVar8 = iVar1;
        } while (iVar1 != -1);
        uVar6 = (funcInfo->bigintToRegister).bucketCount;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar6);
  }
  return;
}

Assistant:

void ByteCodeGenerator::RecordAllBigIntConstants(FuncInfo * funcInfo)
{
    Js::FunctionBody *byteCodeFunction = this->TopFuncInfo()->GetParsedFunctionBody();
    funcInfo->bigintToRegister.Map([byteCodeFunction](ParseNode* pnode, Js::RegSlot location)
    {
        IdentPtr pid = pnode->AsParseNodeBigInt()->pid;
        byteCodeFunction->RecordBigIntConstant(byteCodeFunction->MapRegSlot(location), pid->Psz(), pid->Cch(), pnode->AsParseNodeBigInt()->isNegative);
    });
}